

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLScanner::scanMiscellaneous(XMLScanner *this)

{
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  XMLCh toCheck;
  XMLReader *this_00;
  XMLBuffer *toFill;
  XMLCh *pXVar3;
  XMLSize_t XVar4;
  EndOfEntityException *anon_var_0;
  undefined1 local_20 [6];
  XMLCh nextCh;
  XMLBufBid bbCData;
  XMLScanner *this_local;
  
  bbCData.fMgr = (XMLBufferMgr *)this;
  XMLBufBid::XMLBufBid((XMLBufBid *)local_20,&this->fBufMgr);
  while (toCheck = ReaderMgr::peekNextChar(&this->fReaderMgr), toCheck != L'\0') {
    if (toCheck == L'<') {
      bVar2 = checkXMLDecl(this,true);
      if (bVar2) {
        emitError(this,NotValidAfterContent);
        ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
      }
      else {
        bVar2 = ReaderMgr::skippedString(&this->fReaderMgr,L"<?");
        if (bVar2) {
          scanPI(this);
        }
        else {
          bVar2 = ReaderMgr::skippedString(&this->fReaderMgr,(XMLCh *)XMLUni::fgCommentString);
          if (bVar2) {
            scanComment(this);
          }
          else {
            emitError(this,ExpectedCommentOrPI);
            ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
          }
        }
      }
    }
    else {
      this_00 = ReaderMgr::getCurrentReader(&this->fReaderMgr);
      bVar2 = XMLReader::isWhitespace(this_00,toCheck);
      if (bVar2) {
        if (this->fDocHandler == (XMLDocumentHandler *)0x0) {
          ReaderMgr::skipPastSpaces(&this->fReaderMgr);
        }
        else {
          toFill = XMLBufBid::getBuffer((XMLBufBid *)local_20);
          ReaderMgr::getSpaces(&this->fReaderMgr,toFill);
          pXVar1 = this->fDocHandler;
          pXVar3 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
          XVar4 = XMLBufBid::getLen((XMLBufBid *)local_20);
          (*pXVar1->_vptr_XMLDocumentHandler[8])(pXVar1,pXVar3,XVar4,0);
        }
      }
      else {
        emitError(this,ExpectedCommentOrPI);
        ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
      }
    }
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_20);
  return;
}

Assistant:

void XMLScanner::scanMiscellaneous()
{
    // Get a buffer for this work
    XMLBufBid bbCData(&fBufMgr);

    while (true)
    {
        try
        {
            const XMLCh nextCh = fReaderMgr.peekNextChar();

            // Watch for end of file and break out
            if (!nextCh)
                break;

            if (nextCh == chOpenAngle)
            {
                if (checkXMLDecl(true))
                {
                    // Can't have an XML decl here
                    emitError(XMLErrs::NotValidAfterContent);
                    fReaderMgr.skipPastChar(chCloseAngle);
                }
                else if (fReaderMgr.skippedString(XMLUni::fgPIString))
                {
                    scanPI();
                }
                 else if (fReaderMgr.skippedString(XMLUni::fgCommentString))
                {
                    scanComment();
                }
                else
                {
                    // This can't be possible, so just give up
                    emitError(XMLErrs::ExpectedCommentOrPI);
                    fReaderMgr.skipPastChar(chCloseAngle);
                }
            }
            else if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
            {
                //  If we have a doc handler, then gather up the spaces and
                //  call back. Otherwise, just skip over whitespace.
                if (fDocHandler)
                {
                    fReaderMgr.getSpaces(bbCData.getBuffer());
                    fDocHandler->ignorableWhitespace
                    (
                        bbCData.getRawBuffer()
                        , bbCData.getLen()
                        , false
                    );
                }
                else
                {
                    fReaderMgr.skipPastSpaces();
                }
            }
            else
            {
                emitError(XMLErrs::ExpectedCommentOrPI);
                fReaderMgr.skipPastChar(chCloseAngle);
            }
        }
        catch(const EndOfEntityException&)
        {
            //  Some entity leaked out of the content part of the document. Issue
            //  a warning and keep going.
            emitError(XMLErrs::EntityPropogated);
        }
    }
}